

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O0

void __thiscall gl4cts::DirectStateAccess::ProgramPipelines::DefaultsTest::clean(DefaultsTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  DefaultsTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  if (this->m_program_pipeline_dsa != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x450))(1,&this->m_program_pipeline_dsa);
    this->m_program_pipeline_dsa = 0;
  }
  return;
}

Assistant:

void DefaultsTest::clean()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_program_pipeline_dsa)
	{
		gl.deleteProgramPipelines(1, &m_program_pipeline_dsa);

		m_program_pipeline_dsa = 0;
	}
}